

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
                 (reactor_op *base)

{
  socket_type s;
  bool bVar1;
  native_buffer_type *bufs_00;
  size_t count;
  status local_34;
  undefined1 local_30 [4];
  status result;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  reactive_socket_recv_op_base<asio::mutable_buffers_1> *o;
  reactor_op *base_local;
  
  bufs.total_buffer_size_ = (size_t)base;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffer_sequence_adapter
            ((buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> *)local_30,
             (mutable_buffers_1 *)&base[1].super_operation.func_);
  s = *(socket_type *)(bufs.total_buffer_size_ + 0x38);
  bufs_00 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffers
                      ((buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> *)
                       local_30);
  count = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::count
                    ((buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> *)
                     local_30);
  bVar1 = socket_ops::non_blocking_recv
                    (s,bufs_00,count,*(int *)(bufs.total_buffer_size_ + 0x50),
                     (*(byte *)(bufs.total_buffer_size_ + 0x3c) & 0x10) != 0,
                     (error_code *)(bufs.total_buffer_size_ + 0x18),
                     (size_t *)(bufs.total_buffer_size_ + 0x28));
  local_34 = (status)bVar1;
  if (((local_34 == done) && ((*(byte *)(bufs.total_buffer_size_ + 0x3c) & 0x10) != 0)) &&
     (*(long *)(bufs.total_buffer_size_ + 0x28) == 0)) {
    local_34 = done_and_exhausted;
  }
  return local_34;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }